

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O0

__pid_t __thiscall embree::LinearBarrierActive::wait(LinearBarrierActive *this,void *__stat_loc)

{
  __pid_t _Var1;
  LinearBarrierActive *pLVar2;
  size_t i_5;
  size_t i_4;
  size_t i_1;
  size_t i;
  size_t threadIndex_local;
  LinearBarrierActive *this_local;
  size_t i_7;
  size_t i_6;
  size_t i_3;
  size_t i_2;
  
  if (this->mode == 0) {
    if (__stat_loc == (void *)0x0) {
      for (i = 0; i < this->threadCount; i = i + 1) {
        this->count1[i] = '\0';
      }
      for (i_1 = 1; i_1 < this->threadCount; i_1 = i_1 + 1) {
        while (this->count0[i_1] == '\0') {
          for (i_2 = 0; i_2 < 8; i_2 = i_2 + 1) {
          }
        }
      }
      this->mode = 1;
      this->flag1 = 0;
      this->flag0 = 1;
      pLVar2 = this;
    }
    else {
      this->count0[(long)__stat_loc] = '\x01';
      while (pLVar2 = (LinearBarrierActive *)(ulong)this->flag0, this->flag0 == 0) {
        for (i_3 = 0; i_3 < 8; i_3 = i_3 + 1) {
        }
      }
    }
    _Var1 = (__pid_t)pLVar2;
  }
  else {
    if (__stat_loc == (void *)0x0) {
      for (i_4 = 0; i_4 < this->threadCount; i_4 = i_4 + 1) {
        this->count0[i_4] = '\0';
      }
      for (i_5 = 1; i_5 < this->threadCount; i_5 = i_5 + 1) {
        while (this->count1[i_5] == '\0') {
          for (i_6 = 0; i_6 < 8; i_6 = i_6 + 1) {
          }
        }
      }
      this->mode = 0;
      this->flag0 = 0;
      this->flag1 = 1;
      pLVar2 = this;
    }
    else {
      this->count1[(long)__stat_loc] = '\x01';
      while (pLVar2 = (LinearBarrierActive *)(ulong)this->flag1, this->flag1 == 0) {
        for (i_7 = 0; i_7 < 8; i_7 = i_7 + 1) {
        }
      }
    }
    _Var1 = (__pid_t)pLVar2;
  }
  return _Var1;
}

Assistant:

void LinearBarrierActive::wait (const size_t threadIndex)
  {
    if (mode == 0)
    {			
      if (threadIndex == 0)
      {	
        for (size_t i=0; i<threadCount; i++)
          count1[i] = 0;
        
        for (size_t i=1; i<threadCount; i++)
        {
          while (likely(count0[i] == 0)) 
            pause_cpu();
        }
        mode  = 1;
        flag1 = 0;
        __memory_barrier();
        flag0 = 1;
      }			
      else
      {					
        count0[threadIndex] = 1;
        {
          while (likely(flag0 == 0))
            pause_cpu();
        }
        
      }		
    }					
    else						
    {
      if (threadIndex == 0)
      {	
        for (size_t i=0; i<threadCount; i++)
          count0[i] = 0;
        
        for (size_t i=1; i<threadCount; i++)
        {		
          while (likely(count1[i] == 0))
            pause_cpu();
        }
        
        mode  = 0;
        flag0 = 0;
        __memory_barrier();
        flag1 = 1;
      }			
      else
      {					
        count1[threadIndex] = 1;
        {
          while (likely(flag1 == 0))
            pause_cpu();
        }
      }		
    }					
  }